

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyJointMotor.cpp
# Opt level: O2

void __thiscall
btMultiBodyJointMotor::createConstraintRows
          (btMultiBodyJointMotor *this,btMultiBodyConstraintArray *constraintRows,
          btMultiBodyJacobianData *data,btContactSolverInfo *infoGlobal)

{
  btScalar upperLimit;
  int iVar1;
  eFeatherstoneJointType eVar2;
  float *pfVar3;
  btMultibodyLink *pbVar4;
  btMultiBodySolverConstraint *solverConstraint;
  long lVar5;
  int row;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  btVector3 bVar9;
  btQuadWord local_58;
  btVector3 local_48;
  
  if (((this->super_btMultiBodyConstraint).m_numDofsFinalized ==
       (this->super_btMultiBodyConstraint).m_jacSizeBoth) ||
     ((*(this->super_btMultiBodyConstraint)._vptr_btMultiBodyConstraint[2])(this),
     (this->super_btMultiBodyConstraint).m_numDofsFinalized ==
     (this->super_btMultiBodyConstraint).m_jacSizeBoth)) {
    local_48.m_floats[0] = 0.0;
    local_48.m_floats[1] = 0.0;
    local_48.m_floats[2] = 0.0;
    local_48.m_floats[3] = 0.0;
    for (iVar6 = 0; iVar6 < (this->super_btMultiBodyConstraint).m_numRows; iVar6 = iVar6 + 1) {
      solverConstraint =
           btAlignedObjectArray<btMultiBodySolverConstraint>::expandNonInitializing(constraintRows);
      lVar5 = (long)iVar6 * (long)(this->super_btMultiBodyConstraint).m_jacSizeBoth +
              (long)(this->super_btMultiBodyConstraint).m_numRows;
      pfVar3 = (this->super_btMultiBodyConstraint).m_data.m_data;
      upperLimit = (this->super_btMultiBodyConstraint).m_maxAppliedImpulse;
      btMultiBodyConstraint::fillMultiBodyConstraint
                (&this->super_btMultiBodyConstraint,solverConstraint,data,pfVar3 + lVar5,
                 pfVar3 + (long)(int)lVar5 + (long)(this->super_btMultiBodyConstraint).m_jacSizeA,
                 &local_48,&local_48,&local_48,0.0,infoGlobal,
                 (btScalar)((uint)upperLimit ^ (uint)DAT_001af270),upperLimit,1.0,false,
                 this->m_desiredVelocity,0.0);
      solverConstraint->m_orgConstraint = &this->super_btMultiBodyConstraint;
      solverConstraint->m_orgDofIndex = iVar6;
      iVar1 = (this->super_btMultiBodyConstraint).m_linkA;
      pbVar4 = (((this->super_btMultiBodyConstraint).m_bodyA)->m_links).m_data;
      eVar2 = pbVar4[iVar1].m_jointType;
      if (eVar2 == ePrismatic) {
        local_58.m_floats =
             (btScalar  [4])btTransform::getRotation(&pbVar4[iVar1].m_cachedWorldTransform);
        bVar9 = quatRotate((btQuaternion *)&local_58,
                           &(((this->super_btMultiBodyConstraint).m_bodyA)->m_links).m_data
                            [(this->super_btMultiBodyConstraint).m_linkA].m_axes[0].m_bottomVec);
        *&(solverConstraint->m_contactNormal1).m_floats = bVar9.m_floats;
        auVar8._0_8_ = bVar9.m_floats._0_8_ ^ 0x8000000080000000;
        auVar8._8_4_ = -bVar9.m_floats[2];
        auVar8._12_4_ = 0;
        *(undefined1 (*) [16])(solverConstraint->m_contactNormal2).m_floats = auVar8;
        auVar7 = ZEXT816(0);
        *(undefined1 (*) [16])(solverConstraint->m_relpos1CrossNormal).m_floats = auVar7;
LAB_001932b6:
        *(undefined1 (*) [16])(solverConstraint->m_relpos2CrossNormal).m_floats = auVar7;
      }
      else if (eVar2 == eRevolute) {
        *(undefined1 (*) [16])(solverConstraint->m_contactNormal1).m_floats = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(solverConstraint->m_contactNormal2).m_floats = (undefined1  [16])0x0;
        local_58.m_floats =
             (btScalar  [4])
             btTransform::getRotation
                       (&(((this->super_btMultiBodyConstraint).m_bodyA)->m_links).m_data
                         [(this->super_btMultiBodyConstraint).m_linkA].m_cachedWorldTransform);
        bVar9 = quatRotate((btQuaternion *)&local_58,
                           &(((this->super_btMultiBodyConstraint).m_bodyA)->m_links).m_data
                            [(this->super_btMultiBodyConstraint).m_linkA].m_axes[0].m_topVec);
        *&(solverConstraint->m_relpos1CrossNormal).m_floats = bVar9.m_floats;
        auVar7._0_8_ = bVar9.m_floats._0_8_ ^ 0x8000000080000000;
        auVar7._8_4_ = -bVar9.m_floats[2];
        auVar7._12_4_ = 0;
        goto LAB_001932b6;
      }
    }
  }
  return;
}

Assistant:

void btMultiBodyJointMotor::createConstraintRows(btMultiBodyConstraintArray& constraintRows,
		btMultiBodyJacobianData& data,
		const btContactSolverInfo& infoGlobal)
{
    // only positions need to be updated -- data.m_jacobians and force
    // directions were set in the ctor and never change.
	
	if (m_numDofsFinalized != m_jacSizeBoth)
	{
        finalizeMultiDof();
	}

	//don't crash
	if (m_numDofsFinalized != m_jacSizeBoth)
		return;

	const btScalar posError = 0;
	const btVector3 dummy(0, 0, 0);

	for (int row=0;row<getNumRows();row++)
	{
		btMultiBodySolverConstraint& constraintRow = constraintRows.expandNonInitializing();


		fillMultiBodyConstraint(constraintRow,data,jacobianA(row),jacobianB(row),dummy,dummy,dummy,posError,infoGlobal,-m_maxAppliedImpulse,m_maxAppliedImpulse,1,false,m_desiredVelocity);
		constraintRow.m_orgConstraint = this;
		constraintRow.m_orgDofIndex = row;
		{
			//expect either prismatic or revolute joint type for now
			btAssert((m_bodyA->getLink(m_linkA).m_jointType == btMultibodyLink::eRevolute)||(m_bodyA->getLink(m_linkA).m_jointType == btMultibodyLink::ePrismatic));
			switch (m_bodyA->getLink(m_linkA).m_jointType)
			{
				case btMultibodyLink::eRevolute:
				{
					constraintRow.m_contactNormal1.setZero();
					constraintRow.m_contactNormal2.setZero();
					btVector3 revoluteAxisInWorld = quatRotate(m_bodyA->getLink(m_linkA).m_cachedWorldTransform.getRotation(),m_bodyA->getLink(m_linkA).m_axes[0].m_topVec);
					constraintRow.m_relpos1CrossNormal=revoluteAxisInWorld;
					constraintRow.m_relpos2CrossNormal=-revoluteAxisInWorld;
					
					break;
				}
				case btMultibodyLink::ePrismatic:
				{
					btVector3 prismaticAxisInWorld = quatRotate(m_bodyA->getLink(m_linkA).m_cachedWorldTransform.getRotation(),m_bodyA->getLink(m_linkA).m_axes[0].m_bottomVec);
					constraintRow.m_contactNormal1=prismaticAxisInWorld;
					constraintRow.m_contactNormal2=-prismaticAxisInWorld;
					constraintRow.m_relpos1CrossNormal.setZero();
					constraintRow.m_relpos2CrossNormal.setZero();
					
					break;
				}
				default:
				{
					btAssert(0);
				}
			};
			
		}

	}

}